

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_open_bound(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_udp_t client;
  undefined1 auStack_538 [16];
  uv_buf_t uStack_528;
  sockaddr sStack_518;
  undefined2 uStack_508;
  undefined1 uStack_506;
  undefined5 uStack_505;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined6 uStack_4c0;
  undefined2 uStack_4ba;
  undefined6 uStack_4b8;
  undefined8 uStack_4b2;
  uv_udp_t uStack_4a0;
  uv_udp_send_t uStack_3e8;
  uv_loop_t *puStack_2a0;
  uv_buf_t uStack_280;
  sockaddr_in sStack_270;
  uv_udp_t uStack_260;
  uv_udp_t uStack_1a8;
  uv_loop_t *puStack_f0;
  long local_e0;
  long local_d8;
  sockaddr_in local_d0;
  uv_udp_t local_c0;
  
  puStack_f0 = (uv_loop_t *)0x1dbb45;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_d0);
  local_c0.data = (void *)(long)iVar1;
  local_e0 = 0;
  if (local_c0.data == (void *)0x0) {
    puStack_f0 = (uv_loop_t *)0x1dbb6a;
    uVar2 = create_udp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_f0 = (uv_loop_t *)0x1dbb7d;
    iVar1 = bind(uVar2,(sockaddr *)&local_d0,0x10);
    local_c0.data = (void *)(long)iVar1;
    local_e0 = 0;
    if (local_c0.data != (void *)0x0) goto LAB_001dbcb9;
    puStack_f0 = (uv_loop_t *)0x1dbba2;
    puVar4 = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1dbbaf;
    iVar1 = uv_udp_init(puVar4,&local_c0);
    local_e0 = (long)iVar1;
    local_d8 = 0;
    if (local_e0 != 0) goto LAB_001dbcc8;
    puStack_f0 = (uv_loop_t *)0x1dbbdb;
    iVar1 = uv_udp_open(&local_c0,uVar2);
    local_e0 = (long)iVar1;
    local_d8 = 0;
    if (local_e0 != 0) goto LAB_001dbcd7;
    puStack_f0 = (uv_loop_t *)0x1dbc13;
    iVar1 = uv_udp_recv_start(&local_c0,alloc_cb,recv_cb);
    local_e0 = (long)iVar1;
    local_d8 = 0;
    if (local_e0 != 0) goto LAB_001dbce6;
    puStack_f0 = (uv_loop_t *)0x1dbc3f;
    uv_close((uv_handle_t *)&local_c0,(uv_close_cb)0x0);
    puStack_f0 = (uv_loop_t *)0x1dbc44;
    puVar4 = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1dbc4e;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_f0 = (uv_loop_t *)0x1dbc53;
    unaff_RBX = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1dbc67;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_f0 = (uv_loop_t *)0x1dbc71;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_e0 = 0;
    puStack_f0 = (uv_loop_t *)0x1dbc7f;
    puVar4 = uv_default_loop();
    puStack_f0 = (uv_loop_t *)0x1dbc87;
    iVar1 = uv_loop_close(puVar4);
    local_d8 = (long)iVar1;
    if (local_e0 == local_d8) {
      puStack_f0 = (uv_loop_t *)0x1dbc9f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_f0 = (uv_loop_t *)0x1dbcb9;
    run_test_udp_open_bound_cold_1();
LAB_001dbcb9:
    puStack_f0 = (uv_loop_t *)0x1dbcc8;
    run_test_udp_open_bound_cold_2();
LAB_001dbcc8:
    puStack_f0 = (uv_loop_t *)0x1dbcd7;
    run_test_udp_open_bound_cold_3();
LAB_001dbcd7:
    puStack_f0 = (uv_loop_t *)0x1dbce6;
    run_test_udp_open_bound_cold_4();
LAB_001dbce6:
    puStack_f0 = (uv_loop_t *)0x1dbcf5;
    run_test_udp_open_bound_cold_5();
  }
  puStack_f0 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  puStack_f0 = unaff_RBX;
  uStack_280 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_270);
  uStack_1a8.data = (void *)(long)iVar1;
  uStack_260.data = (void *)0x0;
  if (uStack_1a8.data == (void *)0x0) {
    uVar2 = create_udp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puVar4 = uv_default_loop();
    iVar1 = uv_udp_init(puVar4,&uStack_1a8);
    uStack_260.data = (void *)(long)iVar1;
    if (uStack_260.data != (void *)0x0) goto LAB_001dbfbd;
    iVar1 = connect(uVar2,(sockaddr *)&sStack_270,0x10);
    uStack_260.data = (void *)(long)iVar1;
    if (uStack_260.data != (void *)0x0) goto LAB_001dbfca;
    iVar1 = uv_udp_open(&uStack_1a8,uVar2);
    uStack_260.data = (void *)(long)iVar1;
    if (uStack_260.data != (void *)0x0) goto LAB_001dbfd7;
    puVar4 = uv_default_loop();
    iVar1 = uv_udp_init(puVar4,&uStack_260);
    if (iVar1 != 0) goto LAB_001dbfe4;
    iVar1 = uv_udp_bind(&uStack_260,(sockaddr *)&sStack_270,0);
    if (iVar1 != 0) goto LAB_001dbff1;
    iVar1 = uv_udp_recv_start(&uStack_260,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_001dbffe;
    iVar1 = uv_udp_send(&send_req,&uStack_1a8,&uStack_280,1,(sockaddr *)0x0,send_cb);
    if (iVar1 != 0) goto LAB_001dc00b;
    puVar4 = uv_default_loop();
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_001dc018;
    if (close_cb_called != 2) goto LAB_001dc025;
    if (uStack_1a8.send_queue_size != 0) goto LAB_001dc032;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_open_connect_cold_1();
LAB_001dbfbd:
    run_test_udp_open_connect_cold_2();
LAB_001dbfca:
    run_test_udp_open_connect_cold_3();
LAB_001dbfd7:
    run_test_udp_open_connect_cold_4();
LAB_001dbfe4:
    run_test_udp_open_connect_cold_5();
LAB_001dbff1:
    run_test_udp_open_connect_cold_6();
LAB_001dbffe:
    run_test_udp_open_connect_cold_7();
LAB_001dc00b:
    run_test_udp_open_connect_cold_8();
LAB_001dc018:
    run_test_udp_open_connect_cold_9();
LAB_001dc025:
    run_test_udp_open_connect_cold_10();
LAB_001dc032:
    run_test_udp_open_connect_cold_11();
  }
  run_test_udp_open_connect_cold_12();
  handle = (uv_handle_t *)auStack_538;
  puStack_2a0 = unaff_RBX;
  uStack_528 = uv_buf_init("PING",4);
  puVar4 = uv_default_loop();
  uStack_505 = 0;
  uStack_500._0_4_ = 0;
  uStack_500._4_4_ = 0;
  uStack_4f8 = 0;
  uStack_4f0 = 0;
  uStack_4e8 = 0;
  uStack_4e0 = 0;
  uStack_4d8 = 0;
  uStack_4d0 = 0;
  uStack_4c8 = 0;
  uStack_4c0 = 0;
  uStack_4ba = 0;
  uStack_4b8 = 0;
  uStack_4b2 = 0;
  sStack_518.sa_family = 1;
  uStack_3e8.data = (void *)0x11;
  uStack_4a0.data = (void *)0x6c;
  builtin_strncpy(sStack_518.sa_data,"/tmp/uv-test-s",0xe);
  uStack_508 = 0x636f;
  uStack_506 = 0x6b;
  iVar1 = socket(1,1,0);
  uStack_3e8.data = (void *)(long)iVar1;
  uStack_4a0.data = (void *)0x0;
  if ((long)uStack_3e8.data < 0) {
    uStack_4a0.data = (void *)0x0;
    run_test_udp_send_unix_cold_8();
LAB_001dc302:
    run_test_udp_send_unix_cold_2();
LAB_001dc317:
    run_test_udp_send_unix_cold_3();
LAB_001dc32c:
    run_test_udp_send_unix_cold_4();
LAB_001dc33c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar3 = bind(iVar1,&sStack_518,0x6e);
    uStack_3e8.data = (void *)(long)iVar3;
    uStack_4a0.data = (void *)0x0;
    if (uStack_3e8.data != (void *)0x0) goto LAB_001dc302;
    iVar3 = listen(iVar1,1);
    uStack_3e8.data = (void *)(long)iVar3;
    uStack_4a0.data = (void *)0x0;
    if (uStack_3e8.data != (void *)0x0) goto LAB_001dc317;
    iVar3 = uv_udp_init(puVar4,&uStack_4a0);
    uStack_3e8.data = (void *)(long)iVar3;
    auStack_538._0_8_ = (uv_loop_t *)0x0;
    if (uStack_3e8.data != (void *)0x0) goto LAB_001dc32c;
    iVar3 = uv_udp_open(&uStack_4a0,iVar1);
    uStack_3e8.data = (void *)(long)iVar3;
    auStack_538._0_8_ = (uv_loop_t *)0x0;
    if (uStack_3e8.data != (void *)0x0) goto LAB_001dc33c;
    uv_run(puVar4,UV_RUN_DEFAULT);
    iVar3 = uv_udp_send(&uStack_3e8,&uStack_4a0,&uStack_528,1,(sockaddr *)&sStack_518,
                        (uv_udp_send_cb)0x0);
    auStack_538._0_8_ = SEXT48(iVar3);
    auStack_538._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_538._0_8_ == (uv_loop_t *)0x0) {
      uv_close((uv_handle_t *)&uStack_4a0,(uv_close_cb)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      close(iVar1);
      unlink("/tmp/uv-test-sock");
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      auStack_538._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(puVar4);
      auStack_538._8_8_ = SEXT48(iVar1);
      if (auStack_538._0_8_ == auStack_538._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dc359;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001dc359:
  run_test_udp_send_unix_cold_7();
  if (handle != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open_bound) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = bind(sock, (struct sockaddr*) &addr, sizeof(addr));
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}